

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix.cpp
# Opt level: O1

bool chatter::platform::HostAddressStringToNet32(string *address,uint32_t *out)

{
  int iVar1;
  undefined8 in_RAX;
  bool bVar2;
  in_addr addr;
  in_addr local_14;
  
  local_14.s_addr = (in_addr_t)((ulong)in_RAX >> 0x20);
  if (out != (uint32_t *)0x0) {
    iVar1 = std::__cxx11::string::compare((char *)address);
    if (iVar1 == 0) {
      *out = 0;
      bVar2 = true;
    }
    else {
      iVar1 = inet_aton((address->_M_dataplus)._M_p,&local_14);
      bVar2 = iVar1 != 0;
      if (bVar2) {
        *out = local_14.s_addr;
      }
    }
    return bVar2;
  }
  return false;
}

Assistant:

bool HostAddressStringToNet32(const std::string address, uint32_t* out)
{
    if (!out)
        return false;

    if (address == "") {
        *out = INADDR_ANY;
        return true;
    }

    struct in_addr addr;
    if (inet_aton(address.c_str(), &addr) != 0) {
        *out = addr.s_addr;
        return true;
    }

    return false;
}